

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_walk_agent(REF_INTERP ref_interp,REF_INT id)

{
  REF_AGENT_STRUCT *pRVar1;
  double dVar2;
  REF_GRID pRVar3;
  REF_NODE ref_node;
  REF_AGENTS ref_agents;
  REF_CELL ref_cell;
  uint uVar4;
  REF_AGENT_STRUCT *pRVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  REF_DBL bary [4];
  REF_INT nodes [27];
  
  pRVar3 = ref_interp->from_grid;
  ref_node = pRVar3->node;
  ref_agents = ref_interp->ref_agents;
  ref_cell = (&ref_interp->from_tet)[pRVar3->twod != 0];
  pRVar5 = ref_agents->agent;
  do {
    pRVar1 = pRVar5 + id;
    if (0xd6 < pRVar5[id].step) {
      pRVar1->mode = REF_AGENT_TERMINATED;
      return 0;
    }
    if (pRVar1->mode != REF_AGENT_WALKING) {
      return 0;
    }
    uVar4 = ref_cell_nodes(ref_cell,pRVar1->seed,nodes);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x2a2,"ref_interp_walk_agent",(ulong)uVar4,"cell");
      ref_agents_tattle(ref_agents,id,"cell_nodes in walk");
      return uVar4;
    }
    if (pRVar3->twod == 0) {
      uVar4 = ref_node_bary4(ref_node,nodes,ref_agents->agent[id].xyz,bary);
      if ((uVar4 & 0xfffffffb) != 0) {
        uVar8 = (ulong)uVar4;
        pcVar9 = "bary";
        uVar7 = 0x2ac;
        goto LAB_0015c571;
      }
    }
    else {
      bary[3] = 0.0;
      uVar4 = ref_node_bary3(ref_node,nodes,ref_agents->agent[id].xyz,bary);
      if ((uVar4 & 0xfffffffb) != 0) {
        uVar8 = (ulong)uVar4;
        pcVar9 = "bary";
        uVar7 = 0x2a8;
        goto LAB_0015c571;
      }
    }
    if (0xd7 < ref_agents->agent[id].step) {
      printf("bary %.4e %.4e %.4e %.4e i %.2e s %d\n",bary[0],bary[1],bary[2],bary[3],
             ref_interp->inside);
      uVar4 = ref_agents_tattle(ref_agents,id,"many steps");
      if (uVar4 != 0) {
        uVar8 = (ulong)uVar4;
        pcVar9 = "tat";
        uVar7 = 0x2b3;
        goto LAB_0015c571;
      }
    }
    dVar2 = ref_interp->inside;
    if ((((dVar2 <= bary[0]) && (dVar2 <= bary[1])) && (dVar2 <= bary[2])) && (dVar2 <= bary[3])) {
      pRVar5 = ref_agents->agent;
      pRVar5[id].mode = REF_AGENT_ENCLOSING;
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        pRVar5[id].bary[lVar6] = bary[lVar6];
      }
      return 0;
    }
    if (pRVar3->twod == 0) {
      if ((bary[0] >= bary[1] || bary[0] >= bary[2]) || bary[3] <= bary[0]) {
        if (((bary[0] <= bary[1]) || (bary[3] <= bary[1])) || (bary[2] <= bary[1])) {
          if (((bary[0] <= bary[2]) || (bary[1] <= bary[2])) || (bary[3] <= bary[2])) {
            if (((bary[0] <= bary[3]) || (bary[2] <= bary[3])) || (bary[1] <= bary[3])) {
              if (((bary[1] < bary[0]) || (bary[2] < bary[0])) || (bary[3] < bary[0])) {
                if (((bary[0] < bary[1]) || (bary[3] < bary[1])) || (bary[2] < bary[1])) {
                  if (((bary[0] < bary[2]) || (bary[1] < bary[2])) || (bary[3] < bary[2])) {
                    if (((bary[0] < bary[3]) || (bary[2] < bary[3])) || (bary[1] < bary[3]))
                    goto LAB_0015c45f;
                    uVar4 = ref_update_agent_tet_seed(ref_interp,id,nodes[0],nodes[2],nodes[1]);
                    if (uVar4 != 0) {
                      uVar8 = (ulong)uVar4;
                      pcVar9 = "0 2 1";
                      uVar7 = 0x314;
                      goto LAB_0015c571;
                    }
                  }
                  else {
                    uVar4 = ref_update_agent_tet_seed(ref_interp,id,nodes[0],nodes[1],nodes[3]);
                    if (uVar4 != 0) {
                      uVar8 = (ulong)uVar4;
                      pcVar9 = "0 1 3";
                      uVar7 = 0x30d;
                      goto LAB_0015c571;
                    }
                  }
                }
                else {
                  uVar4 = ref_update_agent_tet_seed(ref_interp,id,nodes[0],nodes[3],nodes[2]);
                  if (uVar4 != 0) {
                    uVar8 = (ulong)uVar4;
                    pcVar9 = "0 3 2";
                    uVar7 = 0x306;
                    goto LAB_0015c571;
                  }
                }
              }
              else {
                uVar4 = ref_update_agent_tet_seed(ref_interp,id,nodes[1],nodes[2],nodes[3]);
                if (uVar4 != 0) {
                  uVar8 = (ulong)uVar4;
                  pcVar9 = "1 2 3";
                  uVar7 = 0x2ff;
                  goto LAB_0015c571;
                }
              }
            }
            else {
              uVar4 = ref_update_agent_tet_seed(ref_interp,id,nodes[0],nodes[2],nodes[1]);
              if (uVar4 != 0) {
                uVar8 = (ulong)uVar4;
                pcVar9 = "0 2 1";
                uVar7 = 0x2f7;
                goto LAB_0015c571;
              }
            }
          }
          else {
            uVar4 = ref_update_agent_tet_seed(ref_interp,id,nodes[0],nodes[1],nodes[3]);
            if (uVar4 != 0) {
              uVar8 = (ulong)uVar4;
              pcVar9 = "0 1 3";
              uVar7 = 0x2f0;
              goto LAB_0015c571;
            }
          }
        }
        else {
          uVar4 = ref_update_agent_tet_seed(ref_interp,id,nodes[0],nodes[3],nodes[2]);
          if (uVar4 != 0) {
            uVar8 = (ulong)uVar4;
            pcVar9 = "0 3 2";
            uVar7 = 0x2e9;
            goto LAB_0015c571;
          }
        }
      }
      else {
        uVar4 = ref_update_agent_tet_seed(ref_interp,id,nodes[1],nodes[2],nodes[3]);
        if (uVar4 != 0) {
          uVar8 = (ulong)uVar4;
          pcVar9 = "1 2 3";
          uVar7 = 0x2e2;
          goto LAB_0015c571;
        }
      }
    }
    else if (bary[0] < bary[1] && bary[0] < bary[2]) {
      uVar4 = ref_update_agent_tri_seed(ref_interp,id,nodes[1],nodes[2]);
      if (uVar4 != 0) {
        uVar8 = (ulong)uVar4;
        pcVar9 = "1 2";
        uVar7 = 0x2c0;
LAB_0015c571:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               uVar7,"ref_interp_walk_agent",uVar8,pcVar9);
        return (REF_STATUS)uVar8;
      }
    }
    else if ((bary[0] <= bary[1]) || (bary[2] <= bary[1])) {
      if (bary[0] <= bary[2]) {
        if ((bary[1] < bary[0]) || (bary[2] < bary[0])) {
          if ((bary[0] < bary[1]) || (bary[2] < bary[1])) {
            if (bary[0] < bary[2]) {
LAB_0015c45f:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x318,"ref_interp_walk_agent","unable to find the next step");
              return 1;
            }
            uVar4 = ref_update_agent_tri_seed(ref_interp,id,nodes[0],nodes[1]);
            if (uVar4 != 0) {
              uVar8 = (ulong)uVar4;
              pcVar9 = "0 1";
              uVar7 = 0x2da;
              goto LAB_0015c571;
            }
          }
          else {
            uVar4 = ref_update_agent_tri_seed(ref_interp,id,nodes[2],nodes[0]);
            if (uVar4 != 0) {
              uVar8 = (ulong)uVar4;
              pcVar9 = "2 0";
              uVar7 = 0x2d5;
              goto LAB_0015c571;
            }
          }
        }
        else {
          uVar4 = ref_update_agent_tri_seed(ref_interp,id,nodes[1],nodes[2]);
          if (uVar4 != 0) {
            uVar8 = (ulong)uVar4;
            pcVar9 = "1 2";
            uVar7 = 0x2d0;
            goto LAB_0015c571;
          }
        }
      }
      else {
        uVar4 = ref_update_agent_tri_seed(ref_interp,id,nodes[0],nodes[1]);
        if (uVar4 != 0) {
          uVar8 = (ulong)uVar4;
          pcVar9 = "0 1";
          uVar7 = 0x2ca;
          goto LAB_0015c571;
        }
      }
    }
    else {
      uVar4 = ref_update_agent_tri_seed(ref_interp,id,nodes[2],nodes[0]);
      if (uVar4 != 0) {
        uVar8 = (ulong)uVar4;
        pcVar9 = "2 0";
        uVar7 = 0x2c5;
        goto LAB_0015c571;
      }
    }
    pRVar5 = ref_agents->agent;
    pRVar5[id].step = pRVar5[id].step + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_interp_walk_agent(REF_INTERP ref_interp,
                                                REF_INT id) {
  REF_GRID ref_grid = ref_interp_from_grid(ref_interp);
  REF_CELL ref_cell;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, limit;
  REF_DBL bary[4];
  REF_AGENTS ref_agents = ref_interp->ref_agents;

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_interp_from_tri(ref_interp);
  } else {
    ref_cell = ref_interp_from_tet(ref_interp);
  }

  limit = 215; /* 10e6^(1/3), required 108 for twod testcase  */

  each_ref_agent_step(ref_agents, id, limit) {
    /* return if no longer walking */
    if (REF_AGENT_WALKING != ref_agent_mode(ref_agents, id)) {
      return REF_SUCCESS;
    }

    RSB(ref_cell_nodes(ref_cell, ref_agent_seed(ref_agents, id), nodes), "cell",
        { ref_agents_tattle(ref_agents, id, "cell_nodes in walk"); });
    /* when REF_DIV_ZERO, min bary is preserved */
    if (ref_grid_twod(ref_grid)) {
      bary[3] = 0.0;
      RXS(ref_node_bary3(ref_node, nodes, ref_agent_xyz_ptr(ref_agents, id),
                         bary),
          REF_DIV_ZERO, "bary");
    } else {
      RXS(ref_node_bary4(ref_node, nodes, ref_agent_xyz_ptr(ref_agents, id),
                         bary),
          REF_DIV_ZERO, "bary");
    }

    if (ref_agent_step(ref_agents, id) > (limit)) {
      printf("bary %.4e %.4e %.4e %.4e i %.2e s %d\n", bary[0], bary[1],
             bary[2], bary[3], ref_interp->inside,
             ref_agent_step(ref_agents, id));
      RSS(ref_agents_tattle(ref_agents, id, "many steps"), "tat");
    }

    if (ref_interp_bary_inside(ref_interp, bary)) {
      ref_agent_mode(ref_agents, id) = REF_AGENT_ENCLOSING;
      for (i = 0; i < 4; i++) ref_agent_bary(ref_agents, i, id) = bary[i];
      return REF_SUCCESS;
    }

    if (ref_grid_twod(ref_grid)) {
      /* less than */
      if (bary[0] < bary[1] && bary[0] < bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[1], nodes[2]),
            "1 2");
        continue;
      }
      if (bary[1] < bary[0] && bary[1] < bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[2], nodes[0]),
            "2 0");
        continue;
      }
      if (bary[2] < bary[0] && bary[2] < bary[0]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[0], nodes[1]),
            "0 1");
        continue;
      }
      /* less than or equal */
      if (bary[0] <= bary[1] && bary[0] <= bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[1], nodes[2]),
            "1 2");
        continue;
      }
      if (bary[1] <= bary[0] && bary[1] <= bary[2]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[2], nodes[0]),
            "2 0");
        continue;
      }
      if (bary[2] <= bary[0] && bary[2] <= bary[0]) {
        RSS(ref_update_agent_tri_seed(ref_interp, id, nodes[0], nodes[1]),
            "0 1");
        continue;
      }
    } else {
      /* less than */
      if (bary[0] < bary[1] && bary[0] < bary[2] && bary[0] < bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[1], nodes[2],
                                      nodes[3]),
            "1 2 3");
        continue;
      }

      if (bary[1] < bary[0] && bary[1] < bary[3] && bary[1] < bary[2]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[3],
                                      nodes[2]),
            "0 3 2");
        continue;
      }

      if (bary[2] < bary[0] && bary[2] < bary[1] && bary[2] < bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[1],
                                      nodes[3]),
            "0 1 3");
        continue;
      }

      if (bary[3] < bary[0] && bary[3] < bary[2] && bary[3] < bary[1]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[2],
                                      nodes[1]),
            "0 2 1");
        continue;
      }

      /* less than or equal */
      if (bary[0] <= bary[1] && bary[0] <= bary[2] && bary[0] <= bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[1], nodes[2],
                                      nodes[3]),
            "1 2 3");
        continue;
      }

      if (bary[1] <= bary[0] && bary[1] <= bary[3] && bary[1] <= bary[2]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[3],
                                      nodes[2]),
            "0 3 2");
        continue;
      }

      if (bary[2] <= bary[0] && bary[2] <= bary[1] && bary[2] <= bary[3]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[1],
                                      nodes[3]),
            "0 1 3");
        continue;
      }

      if (bary[3] <= bary[0] && bary[3] <= bary[2] && bary[3] <= bary[1]) {
        RSS(ref_update_agent_tet_seed(ref_interp, id, nodes[0], nodes[2],
                                      nodes[1]),
            "0 2 1");
        continue;
      }
    }
    THROW("unable to find the next step");
  }

  /* steps reached limit */
  ref_agent_mode(ref_agents, id) = REF_AGENT_TERMINATED;

  return REF_SUCCESS;
}